

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  ImDrawList *pIVar2;
  ImGuiWindow *this;
  ImFont *font;
  char *text_begin;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiContext *pIVar14;
  ImGuiWindow *pIVar15;
  ImU32 IVar16;
  ulong uVar17;
  ulong uVar18;
  char *text_end;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ImRect IVar32;
  ImVec4 local_98;
  ImVec2 local_88;
  ImVec2 IStack_80;
  float local_74;
  float local_70;
  float local_6c;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImRect *local_58;
  float local_50;
  float local_4c;
  ImVec2 *local_48;
  ImDrawList *local_40;
  ImGuiWindow *local_38;
  
  pIVar14 = GImGui;
  local_38 = GImGui->CurrentWindow;
  local_70 = (bb->Min).x;
  local_74 = (bb->Min).y;
  local_4c = ((bb->Max).x - local_70) / (viewport->super_ImGuiViewport).Size.x;
  local_50 = ((bb->Max).y - local_74) / (viewport->super_ImGuiViewport).Size.y;
  local_6c = (viewport->super_ImGuiViewport).Pos.x * local_4c;
  pIVar2 = local_38->DrawList;
  local_98.x = (GImGui->Style).Colors[5].x;
  local_98.y = (GImGui->Style).Colors[5].y;
  uVar3 = (GImGui->Style).Colors[5].z;
  uVar4 = (GImGui->Style).Colors[5].w;
  local_58 = (ImRect *)CONCAT44(local_58._4_4_,(viewport->super_ImGuiViewport).Pos.y * local_50);
  local_98.w = (GImGui->Style).Alpha * 0.4 * (float)uVar4;
  local_98.z = (float)uVar3;
  local_40 = draw_list;
  IVar16 = ColorConvertFloat4ToU32(&local_98);
  local_48 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar2,&bb->Min,&bb->Max,IVar16,0.0,0);
  uVar19 = (pIVar14->Windows).Size;
  uVar17 = (ulong)uVar19;
  if (uVar19 != 0) {
    local_70 = local_70 - local_6c;
    local_74 = local_74 - local_58._0_4_;
    uVar18 = 0;
    local_58 = bb;
    do {
      if ((long)(int)uVar17 <= (long)uVar18) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                      ,0x703,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      this = (pIVar14->Windows).Data[uVar18];
      if ((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) {
        IStack_80.x = (this->Pos).x + (this->Size).x;
        IStack_80.y = (this->Pos).y + (this->Size).y;
        local_88.x = (this->Pos).x;
        local_88.y = (this->Pos).y;
        IVar32 = ImGuiWindow::TitleBarRect(this);
        pIVar15 = local_38;
        fVar20 = (float)(int)(local_88.x * local_4c + local_70);
        fVar22 = (float)(int)(local_88.y * local_50 + local_74);
        fVar23 = (float)(int)(IStack_80.x * local_4c + local_70);
        fVar28 = (float)(int)(IStack_80.y * local_50 + local_74);
        local_68.x = IVar32.Min.x;
        local_68.y = IVar32.Min.y;
        fVar21 = (float)(int)(local_68.x * local_4c + local_70);
        fVar24 = (float)(int)(local_68.y * local_50 + local_74);
        IStack_60.x = IVar32.Max.x;
        fVar29 = (float)(int)(IStack_60.x * local_4c + local_70);
        fVar25 = fVar24 + 5.0;
        IStack_60.y = (bb->Min).y;
        fVar26 = (bb->Max).x;
        fVar27 = (bb->Max).y;
        fVar31 = IStack_60.y;
        if ((IStack_60.y <= fVar22) && (fVar31 = fVar27, fVar22 <= fVar27)) {
          fVar31 = fVar22;
        }
        fVar22 = (bb->Min).x;
        fVar30 = fVar26;
        if (fVar20 <= fVar26) {
          fVar30 = fVar20;
        }
        local_88.x = (float)(-(uint)(fVar20 < fVar22) & (uint)fVar22 |
                            ~-(uint)(fVar20 < fVar22) & (uint)fVar30);
        local_88.y = fVar31;
        fVar31 = IStack_60.y;
        if ((IStack_60.y <= fVar28) && (fVar31 = fVar27, fVar28 <= fVar27)) {
          fVar31 = fVar28;
        }
        fVar20 = fVar26;
        if (fVar23 <= fVar26) {
          fVar20 = fVar23;
        }
        IStack_80.x = (float)(-(uint)(fVar23 < fVar22) & (uint)fVar22 |
                             ~-(uint)(fVar23 < fVar22) & (uint)fVar20);
        IStack_80.y = fVar31;
        local_68.y = IStack_60.y;
        if ((IStack_60.y <= fVar24) && (local_68.y = fVar27, fVar24 <= fVar27)) {
          local_68.y = fVar24;
        }
        fVar31 = fVar26;
        if (fVar21 <= fVar26) {
          fVar31 = fVar21;
        }
        local_68.x = (float)(-(uint)(fVar21 < fVar22) & (uint)fVar22 |
                            ~-(uint)(fVar21 < fVar22) & (uint)fVar31);
        if ((IStack_60.y <= fVar25) && (IStack_60.y = fVar27, fVar25 <= fVar27)) {
          IStack_60.y = fVar25;
        }
        if (fVar29 <= fVar26) {
          fVar26 = fVar29;
        }
        IStack_60.x = (float)(-(uint)(fVar29 < fVar22) & (uint)fVar22 |
                             ~-(uint)(fVar29 < fVar22) & (uint)fVar26);
        if (pIVar14->NavWindow == (ImGuiWindow *)0x0) {
          uVar19 = 10;
        }
        else {
          uVar19 = this->RootWindowForTitleBarHighlight ==
                   pIVar14->NavWindow->RootWindowForTitleBarHighlight | 10;
        }
        pIVar2 = local_38->DrawList;
        local_98.x = (GImGui->Style).Colors[2].x;
        local_98.y = (GImGui->Style).Colors[2].y;
        uVar5 = (GImGui->Style).Colors[2].z;
        uVar6 = (GImGui->Style).Colors[2].w;
        local_98.w = (GImGui->Style).Alpha * (float)uVar6;
        local_98.z = (float)uVar5;
        IVar16 = ColorConvertFloat4ToU32(&local_98);
        ImDrawList::AddRectFilled(pIVar2,&local_88,&IStack_80,IVar16,0.0,0);
        pIVar2 = pIVar15->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar19 << 4));
        local_98._0_8_ = *puVar1;
        uVar7 = puVar1[1];
        local_98.w = (float)((ulong)uVar7 >> 0x20);
        local_98.z = (float)uVar7;
        local_98.w = (GImGui->Style).Alpha * local_98.w;
        IVar16 = ColorConvertFloat4ToU32(&local_98);
        ImDrawList::AddRectFilled(pIVar2,&local_68,&IStack_60,IVar16,0.0,0);
        pIVar2 = pIVar15->DrawList;
        local_98.x = (GImGui->Style).Colors[5].x;
        local_98.y = (GImGui->Style).Colors[5].y;
        uVar8 = (GImGui->Style).Colors[5].z;
        uVar9 = (GImGui->Style).Colors[5].w;
        local_98.w = (GImGui->Style).Alpha * (float)uVar9;
        local_98.z = (float)uVar8;
        IVar16 = ColorConvertFloat4ToU32(&local_98);
        ImDrawList::AddRect(pIVar2,&local_88,&IStack_80,IVar16,0.0,0,1.0);
        pIVar2 = pIVar15->DrawList;
        font = pIVar14->Font;
        local_6c = pIVar14->FontSize;
        local_98.x = (GImGui->Style).Colors[0].x;
        local_98.y = (GImGui->Style).Colors[0].y;
        uVar10 = (GImGui->Style).Colors[0].z;
        uVar11 = (GImGui->Style).Colors[0].w;
        local_98.w = (GImGui->Style).Alpha * (float)uVar11;
        local_98.z = (float)uVar10;
        IVar16 = ColorConvertFloat4ToU32(&local_98);
        bb = local_58;
        text_begin = this->Name;
        text_end = text_begin;
        if (text_begin != (char *)0xffffffffffffffff) {
          do {
            if (*text_end == '#') {
              if (text_end[1] == '#') goto LAB_0014483f;
            }
            else if (*text_end == '\0') goto LAB_0014483f;
            text_end = text_end + 1;
          } while (text_end != (char *)0xffffffffffffffff);
          text_end = (char *)0xffffffffffffffff;
        }
LAB_0014483f:
        ImDrawList::AddText(pIVar2,font,local_6c,&local_68,IVar16,text_begin,text_end,0.0,
                            (ImVec4 *)0x0);
      }
      uVar18 = uVar18 + 1;
      uVar17 = (ulong)(uint)(pIVar14->Windows).Size;
    } while (uVar18 != uVar17);
  }
  local_98.x = (GImGui->Style).Colors[5].x;
  local_98.y = (GImGui->Style).Colors[5].y;
  uVar12 = (GImGui->Style).Colors[5].z;
  uVar13 = (GImGui->Style).Colors[5].w;
  local_98.w = (GImGui->Style).Alpha * (float)uVar13;
  local_98.z = (float)uVar12;
  IVar16 = ColorConvertFloat4ToU32(&local_98);
  ImDrawList::AddRect(local_40,&bb->Min,local_48,IVar16,0.0,0,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}